

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O2

bool Jinx::Impl::operator==(FunctionSignaturePart *left,FunctionSignaturePart *right)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *rightName;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *leftName;
  pointer __lhs;
  
  if (left->partType == right->partType) {
    if (left->partType != Name) {
      return true;
    }
    pbVar1 = (left->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (left->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
      __rhs = (right->names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (right->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (__rhs != pbVar2) {
        bVar3 = std::operator==(__lhs,__rhs);
        __rhs = __rhs + 1;
        if (bVar3) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

inline_t bool operator == (const FunctionSignaturePart & left, const FunctionSignaturePart & right)
	{
		// If the types are different, the parts aren't equal
		if (left.partType != right.partType)
			return false;

		// Check for any matches between the left and right sets of names.  We consider
		// the signature parts equal if there are any matches.
		if (left.partType == FunctionSignaturePartType::Name)
		{
			for (auto & leftName : left.names)
			{
				for (auto & rightName : right.names)
				{
					if (leftName == rightName)
						return true;
				}
			}
			return false;
		}
		return true;
	}